

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O1

void __thiscall
gl4cts::DirectStateAccess::VertexArrays::VertexBuffersTest::Clean(VertexBuffersTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x1680))(0);
  if (this->m_po != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_po = 0;
  }
  if (this->m_vao != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vao);
    this->m_vao = 0;
  }
  if (this->m_bo_array_0 != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_bo_array_0);
    this->m_bo_array_0 = 0;
  }
  if (this->m_bo_array_1 != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_bo_array_1);
    this->m_bo_array_1 = 0;
  }
  if (this->m_bo_xfb != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_bo_xfb);
    this->m_bo_xfb = 0;
  }
  do {
    iVar1 = (**(code **)(lVar2 + 0x800))();
  } while (iVar1 != 0);
  return;
}

Assistant:

void VertexBuffersTest::Clean()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.useProgram(0);

	if (m_po)
	{
		gl.deleteProgram(m_po);

		m_po = 0;
	}

	if (m_vao)
	{
		gl.deleteVertexArrays(1, &m_vao);

		m_vao = 0;
	}

	if (m_bo_array_0)
	{
		gl.deleteBuffers(1, &m_bo_array_0);

		m_bo_array_0 = 0;
	}

	if (m_bo_array_1)
	{
		gl.deleteBuffers(1, &m_bo_array_1);

		m_bo_array_1 = 0;
	}

	if (m_bo_xfb)
	{
		gl.deleteBuffers(1, &m_bo_xfb);

		m_bo_xfb = 0;
	}

	while (gl.getError())
		;
}